

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Ptr * __thiscall
wabt::interp::Instance::Instantiate
          (Ptr *__return_storage_ptr__,Instance *this,Store *store,Ref module,RefVec *imports,
          Ptr *out_trap)

{
  u64 uVar1;
  bool bVar2;
  Result result_00;
  u32 uVar3;
  u32 uVar4;
  Module *pMVar5;
  ModuleDesc *pMVar6;
  value_type *pvVar7;
  const_reference pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Extern *pEVar11;
  Instance *pIVar12;
  pointer pEVar13;
  reference pGVar14;
  Features *this_00;
  reference this_01;
  ElemDesc *pEVar15;
  Table *pTVar16;
  TableType *pTVar17;
  reference this_02;
  DataDesc *pDVar18;
  reference pvVar19;
  Memory *pMVar20;
  MemoryType *pMVar21;
  u64 uVar22;
  u64 uVar23;
  Func *this_03;
  Value value_00;
  u64 local_990;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_888;
  Enum local_86c;
  undefined1 local_868 [8];
  Values results;
  undefined1 local_848 [8];
  Ptr func;
  StartDesc *start;
  const_iterator __end2_8;
  const_iterator __begin2_8;
  vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_> *__range2_8;
  string local_7f8;
  Ptr local_7d8;
  Enum local_7c0;
  Enum local_7bc;
  Enum local_7b8;
  Result local_7b4;
  u64 local_7b0;
  u64 offset_1;
  Enum local_79c;
  FuncDesc local_798;
  Ref local_720;
  Ptr local_718;
  Ref local_700;
  Ref func_ref_2;
  Value offset_op;
  undefined1 local_6e0 [8];
  Ptr memory;
  Result result_1;
  DataDesc *desc_9;
  DataSegment *segment_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_> *__range3_1;
  string local_680;
  Ptr local_660;
  Enum local_648;
  Enum local_644;
  Enum local_640;
  Result local_63c;
  u64 local_638;
  u64 offset;
  Enum local_624;
  FuncDesc local_620;
  Ref local_5a8;
  Ptr local_5a0;
  Ref local_588;
  Ref func_ref_1;
  Value value_1;
  undefined1 local_568 [8];
  Ptr table;
  Result result;
  ElemDesc *desc_8;
  ElemSegment *segment;
  iterator __end3;
  iterator __begin3;
  vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_> *__range3;
  reference pDStack_518;
  int pass;
  reference local_510;
  DataDesc *desc_7;
  const_iterator __end2_7;
  const_iterator __begin2_7;
  vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> *__range2_7;
  reference local_4e8;
  ElemDesc *desc_6;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *__range2_6;
  Ref ref;
  ExportDesc *desc_5;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> *__range2_5;
  Ptr local_478;
  value_type local_460;
  TagType *local_458;
  TagDesc *desc_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_> *__range2_4;
  undefined1 local_428 [48];
  value_type local_3f8;
  size_t local_3f0;
  Enum local_3e4;
  FuncDesc local_3e0;
  Ref local_368;
  Ptr local_360;
  Ref local_348;
  Ref func_ref;
  Value value;
  GlobalDesc *desc_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_> *__range2_3;
  Ptr local_2e0;
  value_type local_2c8;
  MemoryType *local_2c0;
  MemoryDesc *desc_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_> *__range2_2;
  Ptr local_270;
  value_type local_258;
  TableType *local_250;
  TableDesc *desc_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_> *__range2_1;
  Ref local_1b8;
  Ptr local_1b0;
  value_type local_198;
  reference local_190;
  FuncDesc *desc;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_> *__range2;
  undefined1 local_160 [8];
  Ptr extern_;
  string local_130;
  Ptr local_110;
  size_t local_f8;
  size_t local_f0;
  Ref local_e8;
  Ref extern_ref;
  value_type *import_desc;
  size_t i;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_c8;
  allocator<char> local_a9;
  string local_a8;
  Ptr local_88;
  value_type *local_70;
  size_t import_desc_count;
  Ptr inst;
  undefined1 local_48 [8];
  Ptr mod;
  Ptr *out_trap_local;
  RefVec *imports_local;
  Store *store_local;
  Ref module_local;
  
  inst.root_index_ = (Index)store;
  mod.root_index_ = (Index)imports;
  store_local = store;
  module_local.index = (size_t)__return_storage_ptr__;
  RefPtr<wabt::interp::Module>::RefPtr
            ((RefPtr<wabt::interp::Module> *)local_48,(Store *)this,(Ref)store);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            ((RefPtr<wabt::interp::Instance> *)&import_desc_count,(Store *)this,(Store *)this,
             (Ref *)&store_local);
  pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
  pMVar6 = Module::desc(pMVar5);
  local_70 = (value_type *)
             std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::size
                       (&pMVar6->imports);
  pvVar7 = (value_type *)
           std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size
                     ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)module.index)
  ;
  if (pvVar7 < local_70) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"not enough imports!",&local_a9);
    memset(&local_c8,0,0x18);
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector(&local_c8);
    Trap::New(&local_88,(Store *)this,&local_a8,&local_c8);
    RefPtr<wabt::interp::Trap>::operator=((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_88);
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_88);
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector(&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
  }
  else {
    for (import_desc = (value_type *)0x0; import_desc < local_70;
        import_desc = (value_type *)&(import_desc->type).module.field_0x1) {
      pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
      pMVar6 = Module::desc(pMVar5);
      extern_ref.index =
           (size_t)std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                   ::operator[](&pMVar6->imports,(size_type)import_desc);
      pvVar8 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                         ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)
                          module.index,(size_type)import_desc);
      local_f0 = pvVar8->index;
      local_f8 = Ref::Null.index;
      local_e8.index = local_f0;
      bVar2 = interp::operator==((Ref)local_f0,Ref::Null);
      if (bVar2) {
        uVar9 = std::__cxx11::string::c_str();
        uVar10 = std::__cxx11::string::c_str();
        StringPrintf_abi_cxx11_(&local_130,"invalid import \"%s.%s\"",uVar9,uVar10);
        memset(&extern_.root_index_,0,0x18);
        std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                  ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                   &extern_.root_index_);
        Trap::New(&local_110,(Store *)this,&local_130,
                  (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                  &extern_.root_index_);
        RefPtr<wabt::interp::Trap>::operator=
                  ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_110);
        RefPtr<wabt::interp::Trap>::~RefPtr(&local_110);
        std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                  ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                   &extern_.root_index_);
        std::__cxx11::string::~string((string *)&local_130);
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
        goto LAB_00315c72;
      }
      RefPtr<wabt::interp::Extern>::RefPtr
                ((RefPtr<wabt::interp::Extern> *)local_160,(Store *)this,local_e8);
      pEVar11 = RefPtr<wabt::interp::Extern>::operator->((RefPtr<wabt::interp::Extern> *)local_160);
      result_00.enum_ =
           (*(pEVar11->super_Object)._vptr_Object[3])(pEVar11,this,extern_ref.index,mod.root_index_)
      ;
      bVar2 = Failed(result_00);
      if (bVar2) {
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
        bVar2 = true;
      }
      else {
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                  (&pIVar12->imports_,&local_e8);
        pEVar13 = std::
                  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                  ::operator->((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                                *)(extern_ref.index + 0x40));
        switch(pEVar13->kind) {
        case First:
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar12->funcs_,&local_e8);
          break;
        case Table:
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar12->tables_,&local_e8);
          break;
        case Memory:
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar12->memories_,&local_e8);
          break;
        case Global:
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar12->globals_,&local_e8);
          break;
        case Last:
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    (&pIVar12->tags_,&local_e8);
        }
        bVar2 = false;
      }
      RefPtr<wabt::interp::Extern>::~RefPtr((RefPtr<wabt::interp::Extern> *)local_160);
      if (bVar2) goto LAB_00315c72;
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2 = std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::begin
                       (&pMVar6->funcs);
    desc = (FuncDesc *)
           std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::end
                     (&pMVar6->funcs);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
                                       *)&desc), bVar2) {
      local_190 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
                  ::operator*(&__end2);
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      local_1b8 = RefPtr<wabt::interp::Instance>::ref
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      FuncDesc::FuncDesc((FuncDesc *)&__range2_1,local_190);
      DefinedFunc::New(&local_1b0,(Store *)this,local_1b8,(FuncDesc *)&__range2_1);
      local_198.index = (size_t)RefPtr<wabt::interp::DefinedFunc>::ref(&local_1b0);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->funcs_,&local_198);
      RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_1b0);
      FuncDesc::~FuncDesc((FuncDesc *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::FuncDesc_*,_std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>_>
      ::operator++(&__end2);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_1 = std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::begin
                         (&pMVar6->tables);
    desc_1 = (TableDesc *)
             std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::end
                       (&pMVar6->tables);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
                               *)&desc_1), bVar2) {
      local_250 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
                   ::operator*(&__end2_1)->type;
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      TableType::TableType((TableType *)&__range2_2,local_250);
      Table::New(&local_270,(Store *)this,(TableType *)&__range2_2);
      local_258.index = (size_t)RefPtr<wabt::interp::Table>::ref(&local_270);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->tables_,&local_258);
      RefPtr<wabt::interp::Table>::~RefPtr(&local_270);
      TableType::~TableType((TableType *)&__range2_2);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::TableDesc_*,_std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>_>
      ::operator++(&__end2_1);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_2 = std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::
               begin(&pMVar6->memories);
    desc_2 = (MemoryDesc *)
             std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::end
                       (&pMVar6->memories);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
                               *)&desc_2), bVar2) {
      local_2c0 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
                   ::operator*(&__end2_2)->type;
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      MemoryType::MemoryType((MemoryType *)&__range2_3,local_2c0);
      Memory::New(&local_2e0,(Store *)this,(MemoryType *)&__range2_3);
      local_2c8.index = (size_t)RefPtr<wabt::interp::Memory>::ref(&local_2e0);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->memories_,&local_2c8);
      RefPtr<wabt::interp::Memory>::~RefPtr(&local_2e0);
      MemoryType::~MemoryType((MemoryType *)&__range2_3);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::MemoryDesc_*,_std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>_>
      ::operator++(&__end2_2);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_3 = std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::
               begin(&pMVar6->globals);
    desc_3 = (GlobalDesc *)
             std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::end
                       (&pMVar6->globals);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
                               *)&desc_3), bVar2) {
      pGVar14 = __gnu_cxx::
                __normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
                ::operator*(&__end2_3);
      Value::Value((Value *)&func_ref);
      local_368 = RefPtr<wabt::interp::Instance>::ref
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      FuncDesc::FuncDesc(&local_3e0,&pGVar14->init_func);
      DefinedFunc::New(&local_360,(Store *)this,local_368,&local_3e0);
      local_348 = RefPtr<wabt::interp::DefinedFunc>::ref(&local_360);
      RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_360);
      FuncDesc::~FuncDesc(&local_3e0);
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      local_3f0 = local_348.index;
      local_3e4 = (Enum)CallInitFunc(pIVar12,(Store *)this,local_348,(Value *)&func_ref,
                                     (Ptr *)mod.root_index_);
      bVar2 = Failed((Result)local_3e4);
      if (bVar2) {
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
        goto LAB_00315c72;
      }
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      GlobalType::GlobalType((GlobalType *)local_428,&pGVar14->type);
      value_00.field_0._8_8_ = out_trap;
      value_00.field_0.i64_ = value.field_0.i64_;
      Global::New((Ptr *)(local_428 + 0x18),(Global *)this,(Store *)local_428,
                  (GlobalType *)func_ref.index,value_00);
      local_3f8.index =
           (size_t)RefPtr<wabt::interp::Global>::ref
                             ((RefPtr<wabt::interp::Global> *)(local_428 + 0x18));
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->globals_,&local_3f8);
      RefPtr<wabt::interp::Global>::~RefPtr((RefPtr<wabt::interp::Global> *)(local_428 + 0x18));
      GlobalType::~GlobalType((GlobalType *)local_428);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::GlobalDesc_*,_std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>_>
      ::operator++(&__end2_3);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_4 = std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>::begin
                         (&pMVar6->tags);
    desc_4 = (TagDesc *)
             std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>::end
                       (&pMVar6->tags);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<const_wabt::interp::TagDesc_*,_std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>_>
                               *)&desc_4), bVar2) {
      local_458 = &__gnu_cxx::
                   __normal_iterator<const_wabt::interp::TagDesc_*,_std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>_>
                   ::operator*(&__end2_4)->type;
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      TagType::TagType((TagType *)&__range2_5,local_458);
      Tag::New(&local_478,(Store *)this,(TagType *)&__range2_5);
      local_460.index = (size_t)RefPtr<wabt::interp::Tag>::ref(&local_478);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->tags_,&local_460);
      RefPtr<wabt::interp::Tag>::~RefPtr(&local_478);
      TagType::~TagType((TagType *)&__range2_5);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::TagDesc_*,_std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>_>
      ::operator++(&__end2_4);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_5 = std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::
               begin(&pMVar6->exports);
    desc_5 = (ExportDesc *)
             std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::end
                       (&pMVar6->exports);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                               *)&desc_5), bVar2) {
      ref.index = (size_t)__gnu_cxx::
                          __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                          ::operator*(&__end2_5);
      pEVar13 = std::
                unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                ::operator->(&(((reference)ref.index)->type).type);
      switch(pEVar13->kind) {
      case First:
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar19 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar12->funcs_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar19->index;
        break;
      case Table:
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar19 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar12->tables_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar19->index;
        break;
      case Memory:
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar19 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar12->memories_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar19->index;
        break;
      case Global:
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar19 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar12->globals_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar19->index;
        break;
      case Last:
        pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                            ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
        pvVar19 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                            (&pIVar12->tags_,(ulong)*(uint *)(ref.index + 0x28));
        __range2_6 = (vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> *)
                     pvVar19->index;
      }
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                (&pIVar12->exports_,(value_type *)&__range2_6);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
      ::operator++(&__end2_5);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_6 = std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::begin
                         (&pMVar6->elems);
    desc_6 = (ElemDesc *)
             std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::end
                       (&pMVar6->elems);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_6,
                              (__normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
                               *)&desc_6), bVar2) {
      local_4e8 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
                  ::operator*(&__end2_6);
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __range2_7 = (vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> *)
                   local_4e8;
      std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
      emplace_back<wabt::interp::Store&,wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                 &pIVar12->elems_,(Store *)this,(ElemDesc **)&__range2_7,
                 (RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::ElemDesc_*,_std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>_>
      ::operator++(&__end2_6);
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_7 = std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::begin
                         (&pMVar6->datas);
    desc_7 = (DataDesc *)
             std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::end
                       (&pMVar6->datas);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_7,
                              (__normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
                               *)&desc_7), bVar2) {
      local_510 = __gnu_cxx::
                  __normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
                  ::operator*(&__end2_7);
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      pDStack_518 = local_510;
      std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
      emplace_back<wabt::interp::DataDesc_const*>
                ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                 &pIVar12->datas_,&stack0xfffffffffffffae8);
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::DataDesc_*,_std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>_>
      ::operator++(&__end2_7);
    }
    this_00 = Store::features((Store *)this);
    bVar2 = Features::bulk_memory_enabled(this_00);
    for (__range3._4_4_ = (uint)bVar2; (int)__range3._4_4_ < 2; __range3._4_4_ = __range3._4_4_ + 1)
    {
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __end3 = std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::
               begin(&pIVar12->elems_);
      segment = (ElemSegment *)
                std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::
                end(&pIVar12->elems_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
                                         *)&segment), bVar2) {
        this_01 = __gnu_cxx::
                  __normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
                  ::operator*(&__end3);
        pEVar15 = ElemSegment::desc(this_01);
        if (pEVar15->mode == Active) {
          Result::Result((Result *)((long)&table.root_index_ + 4));
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          pvVar19 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                              (&pIVar12->tables_,(ulong)pEVar15->table_index);
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)local_568,(Store *)this,(Ref)pvVar19->index);
          Value::Value((Value *)&func_ref_1);
          local_5a8 = RefPtr<wabt::interp::Instance>::ref
                                ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          FuncDesc::FuncDesc(&local_620,&pEVar15->init_func);
          DefinedFunc::New(&local_5a0,(Store *)this,local_5a8,&local_620);
          local_588 = RefPtr<wabt::interp::DefinedFunc>::ref(&local_5a0);
          RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_5a0);
          FuncDesc::~FuncDesc(&local_620);
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          offset = local_588.index;
          local_624 = (Enum)CallInitFunc(pIVar12,(Store *)this,local_588,(Value *)&func_ref_1,
                                         (Ptr *)mod.root_index_);
          bVar2 = Failed((Result)local_624);
          if (bVar2) {
            RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
            bVar2 = true;
          }
          else {
            pTVar16 = RefPtr<wabt::interp::Table>::operator->
                                ((RefPtr<wabt::interp::Table> *)local_568);
            pTVar17 = Table::type(pTVar16);
            if (((pTVar17->limits).is_64 & 1U) == 0) {
              uVar4 = Value::Get<unsigned_int>((Value *)&func_ref_1);
              local_638 = (u64)uVar4;
            }
            else {
              local_638 = Value::Get<unsigned_long>((Value *)&func_ref_1);
            }
            if (__range3._4_4_ == 0) {
              pTVar16 = RefPtr<wabt::interp::Table>::operator->
                                  ((RefPtr<wabt::interp::Table> *)local_568);
              uVar4 = (u32)local_638;
              uVar3 = ElemSegment::size(this_01);
              bVar2 = Table::IsValidRange(pTVar16,uVar4,uVar3);
              Result::Result(&local_63c,(uint)!bVar2);
              table.root_index_._4_4_ = local_63c.enum_;
            }
            else {
              pTVar16 = RefPtr<wabt::interp::Table>::operator->
                                  ((RefPtr<wabt::interp::Table> *)local_568);
              uVar4 = (u32)local_638;
              uVar3 = ElemSegment::size(this_01);
              local_644 = (Enum)Table::Init(pTVar16,(Store *)this,uVar4,this_01,0,uVar3);
              local_640 = local_644;
              table.root_index_._4_4_ = (Result)local_644;
              bVar2 = Succeeded((Result)local_644);
              if (bVar2) {
                ElemSegment::Drop(this_01);
              }
            }
            local_648 = table.root_index_._4_4_;
            bVar2 = Failed(table.root_index_._4_4_);
            uVar1 = local_638;
            if (bVar2) {
              uVar4 = ElemSegment::size(this_01);
              pTVar16 = RefPtr<wabt::interp::Table>::operator->
                                  ((RefPtr<wabt::interp::Table> *)local_568);
              uVar3 = Table::size(pTVar16);
              StringPrintf_abi_cxx11_
                        (&local_680,
                         "out of bounds table access: elem segment is out of bounds: [%lu, %lu) >= max value %u"
                         ,uVar1,uVar1 + uVar4,(ulong)uVar3);
              memset(&__range3_1,0,0x18);
              std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                        ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                         &__range3_1);
              Trap::New(&local_660,(Store *)this,&local_680,
                        (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                        &__range3_1);
              RefPtr<wabt::interp::Trap>::operator=
                        ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_660);
              RefPtr<wabt::interp::Trap>::~RefPtr(&local_660);
              std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                        ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                         &__range3_1);
              std::__cxx11::string::~string((string *)&local_680);
              RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
          }
          RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_568);
          if (bVar2) goto LAB_00315c72;
        }
        else if (pEVar15->mode == Declared) {
          ElemSegment::Drop(this_01);
        }
        __gnu_cxx::
        __normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
        ::operator++(&__end3);
      }
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      __end3_1 = std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                 ::begin(&pIVar12->datas_);
      segment_1 = (DataSegment *)
                  std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                  ::end(&pIVar12->datas_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
                                 *)&segment_1), bVar2) {
        this_02 = __gnu_cxx::
                  __normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
                  ::operator*(&__end3_1);
        pDVar18 = DataSegment::desc(this_02);
        if (pDVar18->mode == Active) {
          Result::Result((Result *)((long)&memory.root_index_ + 4));
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          pvVar19 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                              (&pIVar12->memories_,(ulong)pDVar18->memory_index);
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)local_6e0,(Store *)this,(Ref)pvVar19->index);
          Value::Value((Value *)&func_ref_2);
          local_720 = RefPtr<wabt::interp::Instance>::ref
                                ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          FuncDesc::FuncDesc(&local_798,&pDVar18->init_func);
          DefinedFunc::New(&local_718,(Store *)this,local_720,&local_798);
          local_700 = RefPtr<wabt::interp::DefinedFunc>::ref(&local_718);
          RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_718);
          FuncDesc::~FuncDesc(&local_798);
          pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                              ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
          offset_1 = local_700.index;
          local_79c = (Enum)CallInitFunc(pIVar12,(Store *)this,local_700,(Value *)&func_ref_2,
                                         (Ptr *)mod.root_index_);
          bVar2 = Failed((Result)local_79c);
          if (bVar2) {
            RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
            bVar2 = true;
          }
          else {
            pMVar20 = RefPtr<wabt::interp::Memory>::operator->
                                ((RefPtr<wabt::interp::Memory> *)local_6e0);
            pMVar21 = Memory::type(pMVar20);
            if (((pMVar21->limits).is_64 & 1U) == 0) {
              uVar4 = Value::Get<unsigned_int>((Value *)&func_ref_2);
              local_990 = (u64)uVar4;
            }
            else {
              local_990 = Value::Get<unsigned_long>((Value *)&func_ref_2);
            }
            local_7b0 = local_990;
            if (__range3._4_4_ == 0) {
              pMVar20 = RefPtr<wabt::interp::Memory>::operator->
                                  ((RefPtr<wabt::interp::Memory> *)local_6e0);
              uVar1 = local_7b0;
              uVar22 = DataSegment::size(this_02);
              bVar2 = Memory::IsValidAccess(pMVar20,uVar1,0,uVar22);
              Result::Result(&local_7b4,(uint)!bVar2);
              memory.root_index_._4_4_ = local_7b4.enum_;
            }
            else {
              pMVar20 = RefPtr<wabt::interp::Memory>::operator->
                                  ((RefPtr<wabt::interp::Memory> *)local_6e0);
              uVar1 = local_7b0;
              uVar22 = DataSegment::size(this_02);
              local_7bc = (Enum)Memory::Init(pMVar20,uVar1,this_02,0,uVar22);
              local_7b8 = local_7bc;
              memory.root_index_._4_4_ = (Result)local_7bc;
              bVar2 = Succeeded((Result)local_7bc);
              if (bVar2) {
                DataSegment::Drop(this_02);
              }
            }
            local_7c0 = memory.root_index_._4_4_;
            bVar2 = Failed(memory.root_index_._4_4_);
            uVar1 = local_7b0;
            if (bVar2) {
              uVar22 = DataSegment::size(this_02);
              pMVar20 = RefPtr<wabt::interp::Memory>::operator->
                                  ((RefPtr<wabt::interp::Memory> *)local_6e0);
              uVar23 = Memory::ByteSize(pMVar20);
              StringPrintf_abi_cxx11_
                        (&local_7f8,
                         "out of bounds memory access: data segment is out of bounds: [%lu, %lu) >= max value %lu"
                         ,uVar1,uVar1 + uVar22,uVar23);
              memset(&__range2_8,0,0x18);
              std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
                        ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                         &__range2_8);
              Trap::New(&local_7d8,(Store *)this,&local_7f8,
                        (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                        &__range2_8);
              RefPtr<wabt::interp::Trap>::operator=
                        ((RefPtr<wabt::interp::Trap> *)mod.root_index_,&local_7d8);
              RefPtr<wabt::interp::Trap>::~RefPtr(&local_7d8);
              std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
                        ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
                         &__range2_8);
              std::__cxx11::string::~string((string *)&local_7f8);
              RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
          }
          RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_6e0);
          if (bVar2) goto LAB_00315c72;
        }
        else if (pDVar18->mode == Declared) {
          DataSegment::Drop(this_02);
        }
        __gnu_cxx::
        __normal_iterator<wabt::interp::DataSegment_*,_std::vector<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>_>
        ::operator++(&__end3_1);
      }
    }
    pMVar5 = RefPtr<wabt::interp::Module>::operator->((RefPtr<wabt::interp::Module> *)local_48);
    pMVar6 = Module::desc(pMVar5);
    __end2_8 = std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::begin
                         (&pMVar6->starts);
    start = (StartDesc *)
            std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::end
                      (&pMVar6->starts);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_8,
                              (__normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
                               *)&start), bVar2) {
      func.root_index_ =
           (Index)__gnu_cxx::
                  __normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
                  ::operator*(&__end2_8);
      pIVar12 = RefPtr<wabt::interp::Instance>::operator->
                          ((RefPtr<wabt::interp::Instance> *)&import_desc_count);
      pvVar19 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                          (&pIVar12->funcs_,(ulong)*(uint *)func.root_index_);
      results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pvVar19->index;
      RefPtr<wabt::interp::Func>::RefPtr
                ((RefPtr<wabt::interp::Func> *)local_848,(Store *)this,
                 (Ref)results.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
                ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_868);
      this_03 = RefPtr<wabt::interp::Func>::operator->((RefPtr<wabt::interp::Func> *)local_848);
      memset(&local_888,0,0x18);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector(&local_888);
      local_86c = (Enum)Func::Call(this_03,(Store *)this,&local_888,(Values *)local_868,
                                   (Ptr *)mod.root_index_,(Stream *)0x0);
      bVar2 = Failed((Result)local_86c);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_888);
      if (bVar2) {
        RefPtr<wabt::interp::Instance>::RefPtr(__return_storage_ptr__);
      }
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
                ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)local_868);
      RefPtr<wabt::interp::Func>::~RefPtr((RefPtr<wabt::interp::Func> *)local_848);
      if (bVar2) goto LAB_00315c72;
      __gnu_cxx::
      __normal_iterator<const_wabt::interp::StartDesc_*,_std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>_>
      ::operator++(&__end2_8);
    }
    RefPtr<wabt::interp::Instance>::RefPtr
              (__return_storage_ptr__,(RefPtr<wabt::interp::Instance> *)&import_desc_count);
  }
LAB_00315c72:
  RefPtr<wabt::interp::Instance>::~RefPtr((RefPtr<wabt::interp::Instance> *)&import_desc_count);
  RefPtr<wabt::interp::Module>::~RefPtr((RefPtr<wabt::interp::Module> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Tag:    inst->tags_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    Value value;
    Ref func_ref = DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
    if (Failed(inst->CallInitFunc(store, func_ref, &value, out_trap))) {
      return {};
    }
    inst->globals_.push_back(Global::New(store, desc.type, value).ref());
  }

  // Tags.
  for (auto&& desc : mod->desc().tags) {
    inst->tags_.push_back(Tag::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports) {
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Tag:    ref = inst->tags_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(store, &desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  // The MVP requires that all segments are bounds-checked before being copied
  // into the table or memory. The bulk memory proposal changes this behavior;
  // instead, each segment is copied in order. If any segment fails, then no
  // further segments are copied. Any data that was written persists.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        Value value;
        Ref func_ref =
            DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
        if (Failed(inst->CallInitFunc(store, func_ref, &value, out_trap))) {
          return {};
        }

        u64 offset;
        if (table->type().limits.is_64) {
          offset = value.Get<u64>();
        } else {
          offset = value.Get<u32>();
        }

        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          if (Succeeded(result)) {
            segment.Drop();
          }
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store,
              StringPrintf("out of bounds table access: elem segment is "
                           "out of bounds: [%" PRIu64 ", %" PRIu64
                           ") >= max value %u",
                           offset, offset + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        Value offset_op;
        Ref func_ref =
            DefinedFunc::New(store, inst.ref(), desc.init_func).ref();
        if (Failed(inst->CallInitFunc(store, func_ref, &offset_op, out_trap))) {
          return {};
        }
        u64 offset = memory->type().limits.is_64 ? offset_op.Get<u64>()
                                                 : offset_op.Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          if (Succeeded(result)) {
            segment.Drop();
          }
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds memory access: data segment is "
                         "out of bounds: [%" PRIu64 ", %" PRIu64
                         ") >= max value %" PRIu64,
                         offset, offset + segment.size(), memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}